

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

Error __thiscall
asmjit::ZoneVectorBase::_resize(ZoneVectorBase *this,ZoneHeap *heap,size_t sizeOfT,size_t n)

{
  Zone *pZVar1;
  Block *pBVar2;
  ZoneHeap *this_00;
  char cVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  sbyte sVar7;
  Error EVar8;
  Slot *pSVar10;
  sbyte sVar11;
  ulong uVar12;
  Slot *pSVar13;
  Block *pBVar14;
  ulong extraout_RDX;
  Slot *pSVar15;
  ulong *puVar16;
  ulong extraout_RDX_00;
  ZoneHeap *extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  ulong unaff_RBP;
  uint uVar17;
  ZoneHeap *this_01;
  ZoneHeap *pZVar18;
  ZoneVectorBase *pZVar19;
  ZoneHeap *pZVar20;
  ZoneHeap *pZVar21;
  ulong in_R8;
  ulong uVar22;
  undefined1 *puVar23;
  undefined1 *puVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ZoneHeap *unaff_R13;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  size_t sStack_d8;
  ZoneHeap *pZStack_d0;
  ZoneHeap *pZStack_c8;
  ZoneHeap *pZStack_c0;
  code *pcStack_b0;
  size_t sStack_a8;
  ulong uStack_a0;
  ZoneVectorBase *pZStack_98;
  ulong uStack_90;
  code *pcStack_88;
  undefined8 uStack_80;
  code *pcStack_78;
  uint uStack_6c;
  ZoneHeap *pZStack_68;
  ulong uStack_60;
  size_t sStack_58;
  ZoneHeap *pZStack_50;
  uint uVar9;
  
  pZVar20 = (ZoneHeap *)this->_length;
  if (n <= this->_capacity) {
LAB_00119389:
    if (pZVar20 <= n && n - (long)pZVar20 != 0) {
      memset((void *)((long)pZVar20 * sizeOfT + (long)this->_data),0,(n - (long)pZVar20) * sizeOfT);
    }
    this->_length = n;
    return 0;
  }
  uVar12 = n - (long)pZVar20;
  pZVar19 = this;
  EVar8 = _grow(this,heap,sizeOfT,uVar12);
  if (EVar8 != 0) {
    return EVar8;
  }
  if (n <= this->_capacity) goto LAB_00119389;
  _resize();
  sStack_58 = n;
  pZStack_50 = pZVar20;
  if (uVar12 < extraout_RDX) {
    pcStack_78 = (code *)0x119668;
    ZoneBitVector::_resize();
    uVar25 = n;
LAB_00119668:
    bVar4 = false;
LAB_001194b7:
    if (!bVar4) {
      return 1;
    }
LAB_001194c4:
    heap = pZVar20;
    this_01 = (ZoneHeap *)(unaff_RBP >> 6);
    uVar9 = (uint)uVar25 & 0x3f;
    sVar7 = (sbyte)uVar9;
    pSVar15 = (Slot *)-(in_R8 & 0xff);
    unaff_RBP = unaff_RBP & 0x3f;
    pZVar19 = this;
    if (unaff_RBP != 0) {
      pZVar20 = (ZoneHeap *)(uVar25 >> 6);
      sVar11 = 0;
      if ((this_01 == pZVar20) && (sVar11 = sVar7, uVar9 <= (uint)unaff_RBP)) {
        pcStack_78 = (code *)0x119692;
        ZoneBitVector::_resize();
LAB_00119692:
        pcStack_78 = (code *)0x119697;
        ZoneBitVector::_resize();
        goto LAB_00119697;
      }
      unaff_R13->_slots[(long)((long)&this_01[-1]._dynamicBlocks + 7)] =
           (Slot *)((ulong)unaff_R13->_slots[(long)((long)&this_01[-1]._dynamicBlocks + 7)] |
                   (long)pSVar15 << (sVar11 - (char)unaff_RBP & 0x3fU));
      this_01 = (ZoneHeap *)((long)&this_01->_zone + 1);
    }
    auVar6 = _DAT_00135c00;
    auVar5 = _DAT_00135bf0;
    uVar22 = uVar25 + 0x40 >> 6;
    lVar26 = uVar22 - 1;
    uVar12 = (ulong)(lVar26 * 0x40 == uVar25);
    pZVar20 = (ZoneHeap *)(lVar26 - uVar12);
    if (this_01 <= pZVar20) {
      puVar23 = (undefined1 *)(uVar22 - uVar12);
      puVar24 = (undefined1 *)((long)&this_01->_zone + 1);
      if (puVar23 <= puVar24) {
        puVar23 = puVar24;
      }
      puVar24 = puVar23 + (-1 - (long)this_01);
      auVar28._8_4_ = (int)puVar24;
      auVar28._0_8_ = puVar24;
      auVar28._12_4_ = (int)((ulong)puVar24 >> 0x20);
      uVar12 = 0;
      auVar28 = auVar28 ^ _DAT_00135c00;
      do {
        auVar30._8_4_ = (int)uVar12;
        auVar30._0_8_ = uVar12;
        auVar30._12_4_ = (int)(uVar12 >> 0x20);
        auVar30 = (auVar30 | auVar5) ^ auVar6;
        if ((bool)(~(auVar30._4_4_ == auVar28._4_4_ && auVar28._0_4_ < auVar30._0_4_ ||
                    auVar28._4_4_ < auVar30._4_4_) & 1)) {
          unaff_R13->_slots[(long)this_01->_slots + (uVar12 - 9)] = pSVar15;
        }
        if ((auVar30._12_4_ != auVar28._12_4_ || auVar30._8_4_ <= auVar28._8_4_) &&
            auVar30._12_4_ <= auVar28._12_4_) {
          unaff_R13->_slots[(long)this_01->_slots + (uVar12 - 8)] = pSVar15;
        }
        uVar12 = uVar12 + 2;
      } while (((ulong)(puVar23 + (1 - (long)this_01)) & 0xfffffffffffffffe) != uVar12);
    }
    if ((uVar25 & 0x3f) == 0) goto LAB_0011961b;
    puVar16 = (ulong *)((long)pZVar20 * 8 + (long)unaff_R13);
  }
  else {
    unaff_RBP = pZVar19->_length;
    uVar25 = extraout_RDX;
    if (unaff_RBP < extraout_RDX) {
      unaff_R13 = (ZoneHeap *)pZVar19->_data;
      this = pZVar19;
      if (extraout_RDX <= pZVar19->_capacity) goto LAB_001194c4;
      sizeOfT = uVar12 + 0x3f & 0xffffffffffffffc0;
      if (sizeOfT < extraout_RDX) goto LAB_00119668;
      if (heap->_zone == (Zone *)0x0) {
        pcStack_78 = (code *)0x119674;
        ZoneBitVector::_resize();
LAB_00119674:
        bVar4 = false;
        in_R8 = (ulong)uStack_6c;
        pZVar20 = heap;
        unaff_R13 = pZStack_68;
        goto LAB_001194b7;
      }
      uStack_6c = (uint)in_R8;
      this_01 = (ZoneHeap *)(sizeOfT >> 3);
      pcStack_78 = (code *)0x11944e;
      pZVar20 = heap;
      pZStack_68 = unaff_R13;
      unaff_R13 = (ZoneHeap *)ZoneHeap::_alloc(heap,(size_t)this_01,&uStack_60);
      if (unaff_R13 == (ZoneHeap *)0x0) goto LAB_00119674;
      uVar12 = uStack_60 * 8;
      if (uStack_60 * 8 < uStack_60) {
        uVar12 = sizeOfT;
      }
      if (unaff_RBP != 0) {
        pcStack_78 = (code *)0x119498;
        this_01 = pZStack_68;
        pZVar20 = unaff_R13;
        memcpy(unaff_R13,pZStack_68,(unaff_RBP + 0x40 >> 6) - 1);
        sizeOfT = uVar12;
      }
      if (pZStack_68 == (ZoneHeap *)0x0) {
LAB_001194ae:
        in_R8 = (ulong)uStack_6c;
        pZVar19->_data = unaff_R13;
        pZVar19->_capacity = uVar12;
        bVar4 = true;
        pZVar20 = heap;
        goto LAB_001194b7;
      }
      if (heap->_zone == (Zone *)0x0) goto LAB_00119692;
      pZVar20 = (ZoneHeap *)pZVar19->_capacity;
      if ((ZoneHeap *)0x7 < pZVar20) {
        pcStack_78 = (code *)0x119656;
        ZoneBitVector::_resize();
        sizeOfT = uVar12;
        goto LAB_001194ae;
      }
LAB_00119697:
      pcStack_78 = ZoneBitVector::_append;
      ZoneBitVector::_resize();
      pSVar10 = pZVar20->_slots[1];
      pSVar15 = (Slot *)0x80;
      if ((Slot *)0x7f < pSVar10) {
        if (pSVar10 < (Slot *)0x4000001) {
          pSVar15 = (Slot *)((long)pSVar10 * 2);
        }
        else {
          pSVar15 = pSVar10 + 0x800000;
        }
      }
      pSVar13 = (Slot *)((long)&pZVar20->_slots[0]->next + 1);
      if ((pSVar10 <= pSVar15) || (pSVar15 = pSVar13, pSVar10 < pSVar13)) {
        EVar8 = ZoneBitVector::_resize
                          ((ZoneBitVector *)pZVar20,this_01,(size_t)pSVar13,(size_t)pSVar15,
                           SUB81(extraout_RDX_00 & 0xffffffff,0));
        return EVar8;
      }
      uStack_80 = 0x1196e9;
      pcStack_78 = (code *)(extraout_RDX_00 & 0xffffffff);
      ZoneBitVector::_append();
      if (extraout_RDX_01 <= this_01) {
        return (uint)(extraout_RDX_01 < this_01) + (uint)(extraout_RDX_01 < this_01) * 2;
      }
      if ((ZoneHeap *)pZVar20->_slots[0] < this_01) {
        pcStack_88 = (code *)0x119875;
        ZoneBitVector::fill();
LAB_00119875:
        pcStack_88 = (code *)0x11987a;
        ZoneBitVector::fill();
LAB_0011987a:
        pcStack_88 = (code *)0x11987f;
        ZoneBitVector::fill();
      }
      else {
        if ((ZoneHeap *)pZVar20->_slots[0] < extraout_RDX_01) goto LAB_00119875;
        pZVar20 = (ZoneHeap *)pZVar20->_zone;
        if (pZVar20 == (ZoneHeap *)0x0) goto LAB_0011987a;
        cVar3 = (char)pSVar13;
        uVar12 = (ulong)this_01 >> 6;
        uVar17 = (uint)this_01 & 0x3f;
        this_01 = (ZoneHeap *)(ulong)uVar17;
        uVar22 = (ulong)extraout_RDX_01 >> 6;
        uVar9 = (uint)extraout_RDX_01 & 0x3f;
        sVar7 = (sbyte)uVar9;
        if (this_01 == (ZoneHeap *)0x0) {
LAB_00119788:
          auVar6 = _DAT_00135c00;
          auVar5 = _DAT_00135bf0;
          lVar26 = uVar22 - uVar12;
          if (uVar12 <= uVar22 && lVar26 != 0) {
            lVar27 = lVar26 + -1;
            auVar29._8_4_ = (int)lVar27;
            auVar29._0_8_ = lVar27;
            auVar29._12_4_ = (int)((ulong)lVar27 >> 0x20);
            uVar25 = 0;
            auVar29 = auVar29 ^ _DAT_00135c00;
            do {
              auVar31._8_4_ = (int)uVar25;
              auVar31._0_8_ = uVar25;
              auVar31._12_4_ = (int)(uVar25 >> 0x20);
              auVar28 = (auVar31 | auVar5) ^ auVar6;
              if ((bool)(~(auVar28._4_4_ == auVar29._4_4_ && auVar29._0_4_ < auVar28._0_4_ ||
                          auVar29._4_4_ < auVar28._4_4_) & 1)) {
                pZVar20->_slots[uVar12 + (uVar25 - 1)] = (Slot *)-((ulong)pSVar13 & 0xff);
              }
              if ((auVar28._12_4_ != auVar29._12_4_ || auVar28._8_4_ <= auVar29._8_4_) &&
                  auVar28._12_4_ <= auVar29._12_4_) {
                pZVar20->_slots[uVar12 + uVar25] = (Slot *)-((ulong)pSVar13 & 0xff);
              }
              uVar25 = uVar25 + 2;
            } while ((lVar26 + 1U & 0xfffffffffffffffe) != uVar25);
          }
          if (((ulong)extraout_RDX_01 & 0x3f) != 0) {
            uVar12 = -1L << sVar7;
            if (cVar3 == '\0') {
              pZVar20->_slots[uVar22 - 1] = (Slot *)((ulong)pZVar20->_slots[uVar22 - 1] & uVar12);
            }
            else {
              pZVar20->_slots[uVar22 - 1] = (Slot *)((ulong)pZVar20->_slots[uVar22 - 1] | ~uVar12);
            }
          }
          return 0;
        }
        sVar11 = (sbyte)uVar17;
        if (uVar12 != uVar22) {
          if (cVar3 == '\0') {
            pZVar20->_slots[uVar12 - 1] =
                 (Slot *)((ulong)pZVar20->_slots[uVar12 - 1] & ~(-1L << sVar11));
          }
          else {
            pZVar20->_slots[uVar12 - 1] =
                 (Slot *)((ulong)pZVar20->_slots[uVar12 - 1] | -1L << sVar11);
          }
          uVar12 = uVar12 + 1;
          goto LAB_00119788;
        }
        if (uVar17 < uVar9) {
          uVar25 = ~(-1L << (sVar7 - sVar11 & 0x3fU)) << sVar11;
          if (cVar3 == '\0') {
            pZVar20->_slots[uVar12 - 1] = (Slot *)((ulong)pZVar20->_slots[uVar12 - 1] & ~uVar25);
          }
          else {
            pZVar20->_slots[uVar12 - 1] = (Slot *)((ulong)pZVar20->_slots[uVar12 - 1] | uVar25);
          }
          return 0;
        }
      }
      pcStack_88 = ZoneStackBase::_init;
      ZoneBitVector::fill();
      pZVar1 = pZVar20->_zone;
      uStack_a0 = uVar25;
      pZStack_98 = pZVar19;
      uStack_90 = sizeOfT;
      pcStack_88 = (code *)unaff_RBP;
      if (pZVar1 != (Zone *)0x0) {
        if ((Block *)pZVar20->_slots[0] != (Block *)0x0) {
          pBVar14 = (Block *)pZVar20->_slots[0];
          if (pZVar1->_ptr == (uint8_t *)0x0) {
            pcStack_b0 = ZoneStackBase::_prepareBlock;
            pZVar18 = this_01;
            pZVar21 = pZVar20;
            ZoneStackBase::_init();
            this_00 = (ZoneHeap *)pZVar21->_zone;
            pZStack_d0 = pZVar20;
            pZStack_c8 = heap;
            pZStack_c0 = this_01;
            pcStack_b0 = (code *)unaff_RBP;
            if (this_00 == (ZoneHeap *)0x0) {
              ZoneStackBase::_prepareBlock();
            }
            else {
              uVar12 = (ulong)pZVar18 & 0xffffffff;
              pSVar15 = pZVar21->_slots[uVar12];
              if (pSVar15[2].next != pSVar15[3].next) {
                if (this_00->_zone != (Zone *)0x0) {
                  pSVar10 = (Slot *)ZoneHeap::_alloc(this_00,0x200,&sStack_d8);
                  if (pSVar10 == (Slot *)0x0) {
                    return 1;
                  }
                  pSVar10[uVar12].next = (Slot *)0x0;
                  pSVar10[(int)pZVar18 == 0].next = pSVar15;
                  pSVar13 = (Slot *)((long)&pSVar10->next + extraout_RDX_03);
                  pSVar10[2].next = pSVar13;
                  pSVar10[3].next = pSVar13;
                  pSVar15[uVar12].next = pSVar10;
                  pZVar21->_slots[uVar12] = pSVar10;
                  return 0;
                }
                goto LAB_001199b6;
              }
            }
            ZoneStackBase::_prepareBlock();
LAB_001199b6:
            ZoneStackBase::_prepareBlock();
            return 1;
          }
          do {
            pBVar2 = pBVar14->next;
            pBVar14->prev = pZVar1[2]._block;
            pZVar1[2]._block = pBVar14;
            pBVar14 = pBVar2;
          } while (pBVar2 != (Block *)0x0);
        }
        pZVar20->_zone = (Zone *)0x0;
        pZVar20->_slots[0] = (Slot *)0x0;
        pZVar20->_slots[1] = (Slot *)0x0;
      }
      EVar8 = 0;
      if (this_01 != (ZoneHeap *)0x0) {
        if (this_01->_zone == (Zone *)0x0) {
          pcStack_b0 = (code *)0x119920;
          ZoneStackBase::_init();
        }
        else {
          pcStack_b0 = (code *)0x1198ed;
          pSVar15 = (Slot *)ZoneHeap::_alloc(this_01,0x200,&sStack_a8);
          if (pSVar15 != (Slot *)0x0) {
            pSVar10 = (Slot *)((long)&pSVar15->next + extraout_RDX_02);
            pSVar15->next = (Slot *)0x0;
            pSVar15[1].next = (Slot *)0x0;
            pSVar15[2].next = pSVar10;
            pSVar15[3].next = pSVar10;
            pZVar20->_zone = (Zone *)this_01;
            pZVar20->_slots[0] = pSVar15;
            pZVar20->_slots[1] = pSVar15;
            return 0;
          }
        }
        EVar8 = 1;
      }
      return EVar8;
    }
    sVar7 = (sbyte)(extraout_RDX & 0x3f);
    if ((extraout_RDX & 0x3f) == 0) goto LAB_0011961b;
    puVar16 = (ulong *)((extraout_RDX >> 3 & 0xfffffffffffffff8) + (long)pZVar19->_data);
  }
  *puVar16 = *puVar16 & ~(-1L << sVar7);
LAB_0011961b:
  pZVar19->_length = uVar25;
  return 0;
}

Assistant:

Error ZoneVectorBase::_resize(ZoneHeap* heap, size_t sizeOfT, size_t n) noexcept {
  size_t length = _length;
  if (_capacity < n) {
    ASMJIT_PROPAGATE(_grow(heap, sizeOfT, n - length));
    ASMJIT_ASSERT(_capacity >= n);
  }

  if (length < n)
    ::memset(static_cast<uint8_t*>(_data) + length * sizeOfT, 0, (n - length) * sizeOfT);

  _length = n;
  return kErrorOk;
}